

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_crt.c
# Opt level: O2

int x509_crt_verify_restartable_ca_cb
              (mbedtls_x509_crt *crt,mbedtls_x509_crt *trust_ca,mbedtls_x509_crl *ca_crl,
              mbedtls_x509_crt_ca_cb_t f_ca_cb,void *p_ca_cb,mbedtls_x509_crt_profile *profile,
              char *cn,uint32_t *flags,
              _func_int_void_ptr_mbedtls_x509_crt_ptr_int_uint32_t_ptr *f_vrfy,void *p_vrfy,
              mbedtls_x509_crt_restart_ctx *rs_ctx)

{
  uint uVar1;
  byte *pbVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  int iVar6;
  mbedtls_pk_type_t mVar7;
  int iVar8;
  long lVar9;
  size_t sVar10;
  size_t __n;
  mbedtls_md_info_t *md_info;
  uint uVar11;
  undefined4 uVar12;
  ulong uVar13;
  uint uVar14;
  mbedtls_x509_sequence *cur_2;
  mbedtls_asn1_sequence *pmVar15;
  mbedtls_x509_crt *pmVar16;
  ulong uVar17;
  mbedtls_x509_crt *parent;
  mbedtls_x509_sequence *cur;
  mbedtls_x509_buf *name;
  mbedtls_x509_sequence *cur_1;
  mbedtls_asn1_named_data *pmVar18;
  mbedtls_asn1_sequence *pmVar19;
  bool bVar20;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined4 local_148;
  uint local_b0;
  uint local_a8 [2];
  uint32_t ip [4];
  int local_5c;
  
  *(undefined4 *)p_ca_cb = 0;
  for (lVar9 = 8; lVar9 != 0xa8; lVar9 = lVar9 + 0x10) {
    *(undefined8 *)((long)&uStack_158 + lVar9) = 0;
    *(undefined4 *)((long)&local_150 + lVar9) = 0xffffffff;
  }
  if (ca_crl == (mbedtls_x509_crl *)0x0) {
    iVar6 = -0x2800;
LAB_001e51d0:
    *(undefined4 *)p_ca_cb = 0xffffffff;
    return iVar6;
  }
  uVar14 = 0;
  if (f_ca_cb != (mbedtls_x509_crt_ca_cb_t)0x0) {
    sVar10 = strlen((char *)f_ca_cb);
    if ((crt->ext_types & 0x20) == 0) {
      for (pmVar18 = &crt->subject; pmVar18 != (mbedtls_asn1_named_data *)0x0;
          pmVar18 = pmVar18->next) {
        if ((((pmVar18->oid).len == 3) && (iVar6 = bcmp("U\x04\x03",(pmVar18->oid).p,3), iVar6 == 0)
            ) && (iVar6 = x509_crt_check_cn(&pmVar18->val,(char *)f_ca_cb,sVar10), uVar14 = 0,
                 iVar6 == 0)) goto LAB_001e4e59;
      }
      uVar14 = 4;
    }
    else {
      bVar3 = false;
      bVar4 = false;
      pmVar15 = &crt->subject_alt_names;
      for (name = &pmVar15->buf; name != (mbedtls_x509_buf *)0x0;
          name = *(mbedtls_x509_buf **)(name + 1)) {
        uVar14 = name->tag & 0x1f;
        if (uVar14 == 7) {
          bVar3 = true;
          bVar20 = bVar4;
        }
        else {
          bVar20 = true;
          if (((uVar14 != 6) && (bVar20 = bVar4, uVar14 == 2)) &&
             (iVar6 = x509_crt_check_cn(name,(char *)f_ca_cb,sVar10), iVar6 == 0)) {
            uVar14 = 0;
            goto LAB_001e4e59;
          }
        }
        bVar4 = bVar20;
      }
      if ((bVar3) &&
         (__n = mbedtls_x509_crt_parse_cn_inet_pton((char *)f_ca_cb,local_a8), pmVar19 = pmVar15,
         __n != 0)) {
        for (; pmVar19 != (mbedtls_asn1_sequence *)0x0; pmVar19 = pmVar19->next) {
          if (((((pmVar19->buf).tag & 0x1fU) == 7) && ((pmVar19->buf).len == __n)) &&
             (iVar6 = bcmp((pmVar19->buf).p,local_a8,__n), iVar6 == 0)) goto LAB_001e51ee;
        }
      }
      if (bVar4) {
        for (; pmVar15 != (mbedtls_x509_sequence *)0x0; pmVar15 = pmVar15->next) {
          if (((((pmVar15->buf).tag & 0x1fU) == 6) && ((pmVar15->buf).len == sVar10)) &&
             (iVar6 = bcmp((pmVar15->buf).p,f_ca_cb,sVar10), iVar6 == 0)) goto LAB_001e51ee;
        }
      }
      uVar14 = 4;
    }
  }
LAB_001e4e59:
  mVar7 = mbedtls_pk_get_type(&crt->pk);
  if ((mVar7 == MBEDTLS_PK_NONE) ||
     ((*(uint *)&(ca_crl->raw).field_0x4 >> ((byte)((char)mVar7 - 1) & 0x1f) & 1) == 0)) {
    uVar14 = uVar14 | 0x8000;
  }
  iVar6 = x509_profile_check_key((mbedtls_x509_crt_profile *)ca_crl,&crt->pk);
  uVar11 = uVar14 + 0x10000;
  if (iVar6 == 0) {
    uVar11 = uVar14;
  }
  bVar3 = false;
  local_5c = 0;
  uVar14 = 0;
LAB_001e4ea9:
  uVar13 = (ulong)uVar14;
  (&local_150)[uVar13 * 2] = crt;
  (&local_148)[uVar13 * 4] = 0;
  uVar1 = uVar14 + 1;
  uVar17 = (ulong)uVar1;
  local_b0 = uVar1;
  if (!bVar3) {
    if ((crt->sig_md == MBEDTLS_MD_NONE) ||
       (uVar12 = 0x8000,
       ((uint)(ca_crl->raw).tag >> ((byte)((char)crt->sig_md - 1) & 0x1f) & 1) == 0)) {
      (&local_148)[uVar13 * 4] = 0x4000;
      uVar12 = 0xc000;
    }
    if ((crt->sig_pk == MBEDTLS_PK_NONE) ||
       ((*(uint *)&(ca_crl->raw).field_0x4 >> ((byte)((char)crt->sig_pk - 1) & 0x1f) & 1) == 0)) {
      (&local_148)[uVar13 * 4] = uVar12;
    }
    if ((uVar14 == 0) &&
       (iVar6 = x509_name_cmp(&crt->issuer,&crt->subject), pmVar16 = trust_ca, iVar6 == 0)) {
      for (; pmVar16 != (mbedtls_x509_crt *)0x0; pmVar16 = pmVar16->next) {
        sVar10 = (crt->raw).len;
        if ((sVar10 == (pmVar16->raw).len) &&
           (iVar6 = bcmp((crt->raw).p,(pmVar16->raw).p,sVar10), iVar6 == 0)) goto LAB_001e5150;
      }
    }
    bVar4 = false;
    bVar3 = true;
    pmVar16 = trust_ca;
LAB_001e4f70:
    while (pmVar16 == (mbedtls_x509_crt *)0x0) {
      if (bVar4) {
        *(byte *)(&local_148 + uVar13 * 4) = *(byte *)(&local_148 + uVar13 * 4) | 8;
        uVar17 = (ulong)local_b0;
        goto LAB_001e5150;
      }
      bVar4 = true;
      bVar3 = false;
      pmVar16 = crt->next;
    }
    iVar6 = x509_name_cmp(&crt->issuer,&pmVar16->subject);
    if ((iVar6 == 0) &&
       ((((!bVar4 && (pmVar16->version < 3)) ||
         ((pmVar16->ca_istrue != 0 &&
          (iVar6 = mbedtls_x509_crt_check_key_usage(pmVar16,4), iVar6 == 0)))) &&
        ((pmVar16->max_pathlen < 1 || (uVar1 - local_5c <= (uint)pmVar16->max_pathlen)))))) {
      md_info = mbedtls_md_info_from_type(crt->sig_md);
      bVar5 = mbedtls_md_get_size(md_info);
      iVar6 = mbedtls_md(md_info,(crt->tbs).p,(crt->tbs).len,(uchar *)local_a8);
      if (iVar6 == 0) {
        iVar6 = mbedtls_pk_can_do(&pmVar16->pk,crt->sig_pk);
        if (iVar6 == 0) goto LAB_001e5001;
        iVar6 = mbedtls_pk_verify_ext
                          (crt->sig_pk,crt->sig_opts,&pmVar16->pk,crt->sig_md,(uchar *)local_a8,
                           (ulong)bVar5,(crt->sig).p,(crt->sig).len);
        bVar20 = iVar6 == 0;
      }
      else {
LAB_001e5001:
        bVar20 = false;
      }
      uVar14 = local_b0;
      if (bVar4 || bVar20) goto LAB_001e5095;
    }
    pmVar16 = pmVar16->next;
    goto LAB_001e4f70;
  }
LAB_001e5150:
  local_148 = local_148 | uVar11;
  while( true ) {
    uVar17 = uVar17 - 1;
    if (uVar17 == 0xffffffffffffffff) {
      if (*p_ca_cb != 0) {
        return -0x2700;
      }
      return 0;
    }
    local_a8[0] = (&local_148)[(uVar17 & 0xffffffff) * 4];
    if ((profile != (mbedtls_x509_crt_profile *)0x0) &&
       (iVar8 = (*(code *)profile)(cn,(&local_150)[(uVar17 & 0xffffffff) * 2],uVar17 & 0xffffffff,
                                   local_a8), iVar8 != 0)) break;
    *(uint *)p_ca_cb = *p_ca_cb | local_a8[0];
  }
  iVar6 = -0x3000;
  if (iVar8 != -0x2700) {
    iVar6 = iVar8;
  }
  goto LAB_001e51d0;
LAB_001e51ee:
  uVar14 = 0;
  goto LAB_001e4e59;
LAB_001e5095:
  if (local_b0 != 1) {
    iVar6 = x509_name_cmp(&crt->issuer,&crt->subject);
    local_5c = local_5c + (uint)(iVar6 == 0);
    if ((bool)(bVar4 & 8 < uVar14)) {
      iVar6 = -0x3000;
      goto LAB_001e51d0;
    }
  }
  if (!bVar20) {
    *(byte *)(&local_148 + uVar13 * 4) = *(byte *)(&local_148 + uVar13 * 4) | 8;
  }
  iVar6 = x509_profile_check_key((mbedtls_x509_crt_profile *)ca_crl,&pmVar16->pk);
  crt = pmVar16;
  uVar14 = local_b0;
  if (iVar6 != 0) {
    pbVar2 = (byte *)((long)&local_148 + uVar13 * 0x10 + 2);
    *pbVar2 = *pbVar2 | 1;
  }
  goto LAB_001e4ea9;
}

Assistant:

static int x509_crt_verify_restartable_ca_cb(mbedtls_x509_crt *crt,
                                             mbedtls_x509_crt *trust_ca,
                                             mbedtls_x509_crl *ca_crl,
                                             mbedtls_x509_crt_ca_cb_t f_ca_cb,
                                             void *p_ca_cb,
                                             const mbedtls_x509_crt_profile *profile,
                                             const char *cn, uint32_t *flags,
                                             int (*f_vrfy)(void *,
                                                           mbedtls_x509_crt *,
                                                           int,
                                                           uint32_t *),
                                             void *p_vrfy,
                                             mbedtls_x509_crt_restart_ctx *rs_ctx)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    mbedtls_pk_type_t pk_type;
    mbedtls_x509_crt_verify_chain ver_chain;
    uint32_t ee_flags;

    *flags = 0;
    ee_flags = 0;
    x509_crt_verify_chain_reset(&ver_chain);

    if (profile == NULL) {
        ret = MBEDTLS_ERR_X509_BAD_INPUT_DATA;
        goto exit;
    }

    /* check name if requested */
    if (cn != NULL) {
        x509_crt_verify_name(crt, cn, &ee_flags);
    }

    /* Check the type and size of the key */
    pk_type = mbedtls_pk_get_type(&crt->pk);

    if (x509_profile_check_pk_alg(profile, pk_type) != 0) {
        ee_flags |= MBEDTLS_X509_BADCERT_BAD_PK;
    }

    if (x509_profile_check_key(profile, &crt->pk) != 0) {
        ee_flags |= MBEDTLS_X509_BADCERT_BAD_KEY;
    }

    /* Check the chain */
    ret = x509_crt_verify_chain(crt, trust_ca, ca_crl,
                                f_ca_cb, p_ca_cb, profile,
                                &ver_chain, rs_ctx);

    if (ret != 0) {
        goto exit;
    }

    /* Merge end-entity flags */
    ver_chain.items[0].flags |= ee_flags;

    /* Build final flags, calling callback on the way if any */
    ret = x509_crt_merge_flags_with_cb(flags, &ver_chain, f_vrfy, p_vrfy);

exit:

#if defined(MBEDTLS_X509_TRUSTED_CERTIFICATE_CALLBACK)
    mbedtls_x509_crt_free(ver_chain.trust_ca_cb_result);
    mbedtls_free(ver_chain.trust_ca_cb_result);
    ver_chain.trust_ca_cb_result = NULL;
#endif /* MBEDTLS_X509_TRUSTED_CERTIFICATE_CALLBACK */

#if defined(MBEDTLS_ECDSA_C) && defined(MBEDTLS_ECP_RESTARTABLE)
    if (rs_ctx != NULL && ret != MBEDTLS_ERR_ECP_IN_PROGRESS) {
        mbedtls_x509_crt_restart_free(rs_ctx);
    }
#endif

    /* prevent misuse of the vrfy callback - VERIFY_FAILED would be ignored by
     * the SSL module for authmode optional, but non-zero return from the
     * callback means a fatal error so it shouldn't be ignored */
    if (ret == MBEDTLS_ERR_X509_CERT_VERIFY_FAILED) {
        ret = MBEDTLS_ERR_X509_FATAL_ERROR;
    }

    if (ret != 0) {
        *flags = (uint32_t) -1;
        return ret;
    }

    if (*flags != 0) {
        return MBEDTLS_ERR_X509_CERT_VERIFY_FAILED;
    }

    return 0;
}